

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeAtomicRMW<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          AtomicRMWOp op,Type type,uint8_t bytes)

{
  uint32_t n;
  undefined1 local_b8 [8];
  MaybeResult<wasm::WATParser::Ok> mem;
  undefined1 local_70 [8];
  Result<wasm::WATParser::Ok> arg;
  Result<wasm::WATParser::Ok> _val_1;
  
  maybeMemidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
            ((MaybeResult<wasm::WATParser::Ok> *)local_b8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   *)local_70,
                  (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   *)local_b8);
  if (arg.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ == '\x02')
  {
    std::__cxx11::string::string
              ((string *)
               ((long)&arg.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20),
               (string *)local_70);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
               __return_storage_ptr__,
               (__index_type *)
               ((long)&arg.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&arg.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_70);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_70);
    memarg<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
              ((Result<wasm::WATParser::Ok> *)local_70,ctx,n);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                    ((long)&arg.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20
                    ),(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_70)
    ;
    if (_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
        '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&mem.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20),(string *)
                         ((long)&arg.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                         0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
                 __return_storage_ptr__,
                 (__index_type *)
                 ((long)&mem.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&mem.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                        ((long)&arg.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                        0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                        ((long)&arg.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                        0x20));
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
           '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_70
                     );
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT>
makeAtomicRMW(Ctx& ctx, Index pos, AtomicRMWOp op, Type type, uint8_t bytes) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeAtomicRMW(pos, op, type, bytes, mem.getPtr(), *arg);
}